

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_string.c
# Opt level: O3

wchar_t strncat_from_utf8_to_utf8(archive_string *as,void *_src,size_t len,archive_string_conv *sc)

{
  wchar_t wVar1;
  wchar_t wVar2;
  archive_string *paVar3;
  size_t s;
  char *p;
  uint32_t uc;
  char t [4];
  wchar_t local_48;
  uint local_44;
  archive_string *local_40;
  char local_34 [4];
  
  local_40 = as;
  paVar3 = archive_string_ensure(as,len + as->length + 1);
  if (paVar3 != (archive_string *)0x0) {
    local_48 = L'\0';
    p = (char *)_src;
LAB_00140a42:
    do {
      wVar2 = _utf8_to_unicode(&local_44,(char *)_src,len);
      if (wVar2 == L'\x03') {
        if ((local_44 & 0xfffff800) != 0xd800) {
LAB_00140a6c:
          _src = (void *)((long)_src + (ulong)(uint)wVar2);
          len = len - (uint)wVar2;
          goto LAB_00140a42;
        }
        wVar2 = L'\xfffffffd';
      }
      else if (L'\0' < wVar2) goto LAB_00140a6c;
      if ((p <= _src && (long)_src - (long)p != 0) &&
         (paVar3 = archive_string_append(local_40,p,(long)_src - (long)p), p = (char *)_src,
         paVar3 == (archive_string *)0x0)) {
        return L'\xffffffff';
      }
      if (wVar2 == L'\0') {
        return local_48;
      }
      if ((local_44 & 0xfffff800) == 0xd800 && wVar2 == L'\xfffffffd') {
        wVar2 = cesu8_to_unicode(&local_44,p,len);
      }
      if (wVar2 < L'\0') {
        local_48 = L'\xffffffff';
      }
      wVar1 = -wVar2;
      if (L'\0' < wVar2) {
        wVar1 = wVar2;
      }
      _src = p + (uint)wVar1;
      len = len - (uint)wVar1;
      s = unicode_to_utf8(local_34,4,local_44);
      paVar3 = archive_string_append(local_40,local_34,s);
      p = (char *)_src;
    } while (paVar3 != (archive_string *)0x0);
  }
  return L'\xffffffff';
}

Assistant:

static int
strncat_from_utf8_to_utf8(struct archive_string *as, const void *_src,
    size_t len, struct archive_string_conv *sc)
{
	int ret = 0;
	const char *src = _src;
	(void)sc; /* UNUSED */

	/* Pre-extend the destination */
	if (archive_string_ensure(as, as->length + len + 1) == NULL)
		return (-1);

	/* Invariant: src points to the first UTF8 byte that hasn't
	 * been copied to the destination `as`. */
	for (;;) {
		int n;
		uint32_t uc;
		const char *e = src;

		/* Skip UTF-8 sequences until we reach end-of-string or
		 * a code point that needs conversion. */
		while ((n = utf8_to_unicode(&uc, e, len)) > 0) {
			e += n;
			len -= n;
		}
		/* Copy the part that doesn't need conversion */
		if (e > src) {
			if (archive_string_append(as, src, e - src) == NULL)
				return (-1);
			src = e;
		}

		if (n == 0) {
			/* We reached end-of-string */
			return (ret);
		} else {
			/* Next code point needs conversion */
			char t[4];
			size_t w;

			/* Try decoding a surrogate pair */
			if (n == -3 && IS_SURROGATE_PAIR_LA(uc)) {
				n = cesu8_to_unicode(&uc, src, len);
			}
			/* Not a (valid) surrogate, so use a replacement char */
			if (n < 0) {
				ret = -1; /* Return -1 if we used any replacement */
				n *= -1;
			}
			/* Consume converted code point */
			src += n;
			len -= n;
			/* Convert and append new UTF-8 sequence. */
			w = unicode_to_utf8(t, sizeof(t), uc);
			if (archive_string_append(as, t, w) == NULL)
				return (-1);
		}
	}
}